

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this
          ,double_na_equal *value)

{
  double dVar1;
  double dVar2;
  primitive_dictionary_entry_t *ppVar3;
  hash_t hVar4;
  primitive_dictionary_entry_t *ppVar5;
  ulong uVar6;
  
  uVar6 = -(ulong)NAN(*(double *)value);
  hVar4 = Hash<double>((double)(~uVar6 & (ulong)*(double *)value | uVar6 & 0x7ff8000000000000));
  ppVar3 = this->dictionary;
  uVar6 = hVar4 & this->capacity_mask;
  ppVar5 = ppVar3 + uVar6;
  if (ppVar3[uVar6].index != 0xffffffff) {
    dVar1 = *(double *)value;
    do {
      dVar2 = *(double *)ppVar5;
      if (NAN(dVar2) && NAN(dVar1)) {
        return ppVar5;
      }
      if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) {
        return ppVar5;
      }
      uVar6 = uVar6 + 1 & this->capacity_mask;
      ppVar5 = ppVar3 + uVar6;
    } while (ppVar3[uVar6].index != 0xffffffff);
  }
  return ppVar5;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}